

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_cstr_copy(char *from,ssize_t i,ssize_t j,char *to,size_t len)

{
  size_t sVar1;
  ssize_t sVar2;
  size_t sVar3;
  void *in_RCX;
  char *in_RDI;
  size_t in_R8;
  ssize_t t;
  size_t len_1;
  ssize_t min;
  size_t flen;
  size_t in_stack_ffffffffffffffa8;
  ssize_t in_stack_ffffffffffffffb0;
  ssize_t local_18;
  ssize_t local_10;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 == 0) {
    local_10 = 0;
    local_18 = 0;
  }
  else {
    local_10 = IDX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    sVar2 = IDX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_18 = sVar2;
    if (sVar2 < local_10) {
      local_18 = local_10;
      local_10 = sVar2;
    }
  }
  sVar3 = IDXLEN(local_10,local_18);
  if (sVar3 < in_R8) {
    in_R8 = sVar3;
  }
  memcpy(in_RCX,in_RDI + local_10,in_R8);
  return in_R8;
}

Assistant:

size_t
zt_cstr_copy(const char * from, ssize_t i, ssize_t j, char * to, size_t len) {
    size_t    flen;
    ssize_t    min;

    CONVERT(from, i, j);
    flen = IDXLEN(i, j);

    min  = MIN(flen, len);
    memcpy(to, &from[i], min);
    return min;
}